

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O0

int evfilt_write_knote_enable(filter *filt,knote *kn)

{
  int iVar1;
  long in_RSI;
  knote *in_stack_00000020;
  filter *in_stack_00000028;
  int in_stack_00000030;
  undefined1 local_24 [32];
  int local_4;
  
  if ((*(uint *)(in_RSI + 0x20) & 1) == 0) {
    local_4 = epoll_update(in_stack_00000030,in_stack_00000028,in_stack_00000020,filt._4_4_,
                           filt._3_1_);
  }
  else {
    local_24._0_4_ = *(uint32_t *)(in_RSI + 0x78);
    local_24._4_8_ = in_RSI + 0x98;
    local_24._12_8_ = in_RSI;
    iVar1 = epoll_ctl(*(int *)(in_RSI + 0x68),1,*(int *)(in_RSI + 0x80),(epoll_event *)local_24);
    if (iVar1 < 0) {
      local_4 = -1;
    }
    else {
      *(undefined4 *)(local_24._12_8_ + 0x6c) = 1;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int
evfilt_write_knote_enable(struct filter *filt, struct knote *kn)
{
    if (kn->kn_flags & KNFL_FILE) {
        if (epoll_ctl(kn->kn_epollfd, EPOLL_CTL_ADD, kn->kn_eventfd, EPOLL_EV_KN(kn->epoll_events, kn)) < 0) {
            dbg_perror("epoll_ctl(2)");
            return (-1);
        }
        kn->kn_registered = 1;
        return (0);
    }

    return epoll_update(EPOLL_CTL_ADD, filt, kn, kn->epoll_events, false);
}